

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O1

int cmCTestLaunch::Main(int argc,char **argv)

{
  int iVar1;
  cmCTestLaunch self;
  cmCTestLaunch cStack_258;
  
  if (argc == 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ctest --launch: this mode is for internal CTest use only",0x38
              );
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    iVar1 = 1;
  }
  else {
    cmCTestLaunch(&cStack_258,argc,argv);
    iVar1 = Run(&cStack_258);
    ~cmCTestLaunch(&cStack_258);
  }
  return iVar1;
}

Assistant:

int cmCTestLaunch::Main(int argc, const char* const argv[])
{
  if(argc == 2)
    {
    std::cerr << "ctest --launch: this mode is for internal CTest use only"
              << std::endl;
    return 1;
    }
  cmCTestLaunch self(argc, argv);
  return self.Run();
}